

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

StatusOr<long>
google::protobuf::json_internal::anon_unknown_5::
ParseInt<google::protobuf::json_internal::ParseProto3Type>
          (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto3Type> field)

{
  uint uVar1;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 extraout_RAX;
  long in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 extraout_RDX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  StatusOr<long> SVar2;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<long>_> n;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>_1
  local_50;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>_1
  local_48;
  size_t local_40;
  size_t local_38 [4];
  
  ParseIntInner<long>((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)
                      &local_48.status_,(JsonLexer *)field,in_XMM0_Qa,in_XMM1_Qa);
  local_50 = local_48;
  if (((ulong)local_48 & 1) == 0) {
    LOCK();
    *(int *)local_48 = *(int *)local_48 + 1;
    UNLOCK();
  }
  if (local_48 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>_1
       )0x1) {
    uVar1 = *(uint *)(*(long *)(in_RDX + 8) + 0x48);
    if (((uVar1 < 0x12) && ((0x2a0a4U >> (uVar1 & 0x1f) & 1) != 0)) &&
       ((long)(int)local_40 != local_40)) {
      JsonLocation::Invalid((JsonLocation *)&local_50,local_38,0x14,"integer out of range");
      absl::lts_20240722::internal_statusor::StatusOrData<long>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<long> *)lex,&local_50.status_);
      if (((ulong)local_50 & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
    }
    else {
      (lex->stream_).last_chunk_._M_len = local_40;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<long>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<long> *)lex,&local_50.status_);
    absl::lts_20240722::Status::~Status(&local_50.status_);
  }
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<long>_>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::LocationWith<long>_> *)&local_48.status_
            );
  SVar2.super_StatusOrData<long>.field_1.data_ = extraout_RDX.data_;
  SVar2.super_StatusOrData<long>.field_0 = extraout_RAX;
  return (StatusOr<long>)SVar2.super_StatusOrData<long>;
}

Assistant:

absl::StatusOr<int64_t> ParseInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<int64_t>> n =
      ParseIntInner<int64_t>(lex, -9007199254740992.0, 9007199254740992.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (std::numeric_limits<int32_t>::min() > n->value ||
        n->value > std::numeric_limits<int32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}